

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.cpp
# Opt level: O0

DataFlowState * __thiscall slang::analysis::DataFlowAnalysis::topState(DataFlowAnalysis *this)

{
  DataFlowState *in_RDI;
  DataFlowState *this_00;
  
  this_00 = in_RDI;
  memset(in_RDI,0,0xa0);
  DataFlowState::DataFlowState(this_00);
  return in_RDI;
}

Assistant:

DataFlowState DataFlowAnalysis::topState() const {
    return {};
}